

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

int cvui::internal::trackbarValueToXPixel
              (TrackbarParams *theParams,Rect *theBounding,longdouble theValue)

{
  double dVar1;
  longdouble thePixelsX;
  longdouble aRatio;
  longdouble theValue_local;
  Rect *theBounding_local;
  TrackbarParams *theParams_local;
  
  dVar1 = clamp01((double)((theValue - *(longdouble *)theParams) /
                          (*(longdouble *)(theParams + 0x10) - *(longdouble *)theParams)));
  return (int)ROUND((double)(theBounding->width + -0x1c) * dVar1 + (double)theBounding->x + 14.0);
}

Assistant:

inline int trackbarValueToXPixel(const TrackbarParams & theParams, cv::Rect & theBounding, long double theValue)
	{
		long double aRatio = (theValue - theParams.min) / (theParams.max - theParams.min);
		aRatio = clamp01(aRatio);
		long double thePixelsX = (long double)theBounding.x + gTrackbarMarginX + aRatio * (long double)(theBounding.width - 2 * gTrackbarMarginX);
		return (int)thePixelsX;
	}